

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int xmlParseDocument(xmlParserCtxtPtr ctxt)

{
  setDocumentLocatorSAXFunc p_Var1;
  void *pvVar2;
  xmlCharEncoding enc_00;
  int iVar3;
  xmlSAXLocator *pxVar4;
  xmlChar *pxVar5;
  xmlChar local_1c;
  xmlChar local_1b;
  xmlChar local_1a;
  xmlChar local_19;
  xmlCharEncoding enc;
  xmlChar start [4];
  xmlParserCtxtPtr ctxt_local;
  
  _enc = ctxt;
  xmlInitParser();
  if ((_enc == (xmlParserCtxtPtr)0x0) || (_enc->input == (xmlParserInputPtr)0x0)) {
    ctxt_local._4_4_ = -1;
  }
  else {
    if ((_enc->progressive == 0) && ((long)_enc->input->end - (long)_enc->input->cur < 0xfa)) {
      xmlGROW(_enc);
    }
    xmlDetectSAX2(_enc);
    if ((_enc->sax != (_xmlSAXHandler *)0x0) &&
       (_enc->sax->setDocumentLocator != (setDocumentLocatorSAXFunc)0x0)) {
      p_Var1 = _enc->sax->setDocumentLocator;
      pvVar2 = _enc->userData;
      pxVar4 = __xmlDefaultSAXLocator();
      (*p_Var1)(pvVar2,pxVar4);
    }
    if (_enc->instate == XML_PARSER_EOF) {
      ctxt_local._4_4_ = -1;
    }
    else {
      if ((_enc->encoding == (xmlChar *)0x0) &&
         (3 < (long)_enc->input->end - (long)_enc->input->cur)) {
        local_1c = *_enc->input->cur;
        local_1b = _enc->input->cur[1];
        local_1a = _enc->input->cur[2];
        local_19 = _enc->input->cur[3];
        enc_00 = xmlDetectCharEncoding(&local_1c,4);
        if (enc_00 != XML_CHAR_ENCODING_NONE) {
          xmlSwitchEncoding(_enc,enc_00);
        }
      }
      if (*_enc->input->cur == '\0') {
        xmlFatalErr(_enc,XML_ERR_DOCUMENT_EMPTY,(char *)0x0);
        ctxt_local._4_4_ = -1;
      }
      else {
        if ((((long)_enc->input->end - (long)_enc->input->cur < 0x23) && (_enc->progressive == 0))
           && ((long)_enc->input->end - (long)_enc->input->cur < 0xfa)) {
          xmlGROW(_enc);
        }
        if ((((*_enc->input->cur == '<') && (_enc->input->cur[1] == '?')) &&
            ((_enc->input->cur[2] == 'x' &&
             ((_enc->input->cur[3] == 'm' && (_enc->input->cur[4] == 'l')))))) &&
           ((_enc->input->cur[5] == ' ' ||
            (((8 < _enc->input->cur[5] && (_enc->input->cur[5] < 0xb)) ||
             (_enc->input->cur[5] == '\r')))))) {
          xmlParseXMLDecl(_enc);
          if ((_enc->errNo == 0x20) || (_enc->instate == XML_PARSER_EOF)) {
            return -1;
          }
          _enc->standalone = _enc->input->standalone;
          xmlSkipBlankChars(_enc);
        }
        else {
          pxVar5 = xmlCharStrdup("1.0");
          _enc->version = pxVar5;
        }
        if (((_enc->sax != (_xmlSAXHandler *)0x0) &&
            (_enc->sax->startDocument != (startDocumentSAXFunc)0x0)) && (_enc->disableSAX == 0)) {
          (*_enc->sax->startDocument)(_enc->userData);
        }
        if (_enc->instate == XML_PARSER_EOF) {
          ctxt_local._4_4_ = -1;
        }
        else {
          if ((((_enc->myDoc != (xmlDocPtr)0x0) && (_enc->input != (xmlParserInputPtr)0x0)) &&
              (_enc->input->buf != (xmlParserInputBufferPtr)0x0)) &&
             (-1 < _enc->input->buf->compressed)) {
            _enc->myDoc->compression = _enc->input->buf->compressed;
          }
          xmlParseMisc(_enc);
          if ((_enc->progressive == 0) && ((long)_enc->input->end - (long)_enc->input->cur < 0xfa))
          {
            xmlGROW(_enc);
          }
          if (((*_enc->input->cur == '<') && (_enc->input->cur[1] == '!')) &&
             (((_enc->input->cur[2] == 'D' &&
               (((_enc->input->cur[3] == 'O' && (_enc->input->cur[4] == 'C')) &&
                (_enc->input->cur[5] == 'T')))) &&
              (((_enc->input->cur[6] == 'Y' && (_enc->input->cur[7] == 'P')) &&
               (_enc->input->cur[8] == 'E')))))) {
            _enc->inSubset = 1;
            xmlParseDocTypeDecl(_enc);
            if (*_enc->input->cur == '[') {
              _enc->instate = XML_PARSER_DTD;
              xmlParseInternalSubset(_enc);
              if (_enc->instate == XML_PARSER_EOF) {
                return -1;
              }
            }
            _enc->inSubset = 2;
            if (((_enc->sax != (_xmlSAXHandler *)0x0) &&
                (_enc->sax->externalSubset != (externalSubsetSAXFunc)0x0)) &&
               (_enc->disableSAX == 0)) {
              (*_enc->sax->externalSubset)
                        (_enc->userData,_enc->intSubName,_enc->extSubSystem,_enc->extSubURI);
            }
            if (_enc->instate == XML_PARSER_EOF) {
              return -1;
            }
            _enc->inSubset = 0;
            xmlCleanSpecialAttr(_enc);
            _enc->instate = XML_PARSER_PROLOG;
            xmlParseMisc(_enc);
          }
          if ((_enc->progressive == 0) && ((long)_enc->input->end - (long)_enc->input->cur < 0xfa))
          {
            xmlGROW(_enc);
          }
          if (*_enc->input->cur == '<') {
            _enc->instate = XML_PARSER_CONTENT;
            xmlParseElement(_enc);
            _enc->instate = XML_PARSER_EPILOG;
            xmlParseMisc(_enc);
            if (*_enc->input->cur != '\0') {
              xmlFatalErr(_enc,XML_ERR_DOCUMENT_END,(char *)0x0);
            }
            _enc->instate = XML_PARSER_EOF;
          }
          else {
            xmlFatalErrMsg(_enc,XML_ERR_DOCUMENT_EMPTY,"Start tag expected, \'<\' not found\n");
          }
          if ((_enc->sax != (_xmlSAXHandler *)0x0) &&
             (_enc->sax->endDocument != (endDocumentSAXFunc)0x0)) {
            (*_enc->sax->endDocument)(_enc->userData);
          }
          if ((_enc->myDoc != (xmlDocPtr)0x0) &&
             (iVar3 = xmlStrEqual(_enc->myDoc->version,(xmlChar *)"SAX compatibility mode document")
             , iVar3 != 0)) {
            xmlFreeDoc(_enc->myDoc);
            _enc->myDoc = (xmlDocPtr)0x0;
          }
          if ((_enc->wellFormed != 0) && (_enc->myDoc != (xmlDocPtr)0x0)) {
            _enc->myDoc->properties = _enc->myDoc->properties | 1;
            if (_enc->valid != 0) {
              _enc->myDoc->properties = _enc->myDoc->properties | 8;
            }
            if (_enc->nsWellFormed != 0) {
              _enc->myDoc->properties = _enc->myDoc->properties | 2;
            }
            if ((_enc->options & 0x20000U) != 0) {
              _enc->myDoc->properties = _enc->myDoc->properties | 4;
            }
          }
          if (_enc->wellFormed == 0) {
            _enc->valid = 0;
            ctxt_local._4_4_ = -1;
          }
          else {
            ctxt_local._4_4_ = 0;
          }
        }
      }
    }
  }
  return ctxt_local._4_4_;
}

Assistant:

int
xmlParseDocument(xmlParserCtxtPtr ctxt) {
    xmlChar start[4];
    xmlCharEncoding enc;

    xmlInitParser();

    if ((ctxt == NULL) || (ctxt->input == NULL))
        return(-1);

    GROW;

    /*
     * SAX: detecting the level.
     */
    xmlDetectSAX2(ctxt);

    /*
     * SAX: beginning of the document processing.
     */
    if ((ctxt->sax) && (ctxt->sax->setDocumentLocator))
        ctxt->sax->setDocumentLocator(ctxt->userData, &xmlDefaultSAXLocator);
    if (ctxt->instate == XML_PARSER_EOF)
	return(-1);

    if ((ctxt->encoding == NULL) &&
        ((ctxt->input->end - ctxt->input->cur) >= 4)) {
	/*
	 * Get the 4 first bytes and decode the charset
	 * if enc != XML_CHAR_ENCODING_NONE
	 * plug some encoding conversion routines.
	 */
	start[0] = RAW;
	start[1] = NXT(1);
	start[2] = NXT(2);
	start[3] = NXT(3);
	enc = xmlDetectCharEncoding(&start[0], 4);
	if (enc != XML_CHAR_ENCODING_NONE) {
	    xmlSwitchEncoding(ctxt, enc);
	}
    }


    if (CUR == 0) {
	xmlFatalErr(ctxt, XML_ERR_DOCUMENT_EMPTY, NULL);
	return(-1);
    }

    /*
     * Check for the XMLDecl in the Prolog.
     * do not GROW here to avoid the detected encoder to decode more
     * than just the first line, unless the amount of data is really
     * too small to hold "<?xml version="1.0" encoding="foo"
     */
    if ((ctxt->input->end - ctxt->input->cur) < 35) {
       GROW;
    }
    if ((CMP5(CUR_PTR, '<', '?', 'x', 'm', 'l')) && (IS_BLANK_CH(NXT(5)))) {

	/*
	 * Note that we will switch encoding on the fly.
	 */
	xmlParseXMLDecl(ctxt);
	if ((ctxt->errNo == XML_ERR_UNSUPPORTED_ENCODING) ||
	    (ctxt->instate == XML_PARSER_EOF)) {
	    /*
	     * The XML REC instructs us to stop parsing right here
	     */
	    return(-1);
	}
	ctxt->standalone = ctxt->input->standalone;
	SKIP_BLANKS;
    } else {
	ctxt->version = xmlCharStrdup(XML_DEFAULT_VERSION);
    }
    if ((ctxt->sax) && (ctxt->sax->startDocument) && (!ctxt->disableSAX))
        ctxt->sax->startDocument(ctxt->userData);
    if (ctxt->instate == XML_PARSER_EOF)
	return(-1);
    if ((ctxt->myDoc != NULL) && (ctxt->input != NULL) &&
        (ctxt->input->buf != NULL) && (ctxt->input->buf->compressed >= 0)) {
	ctxt->myDoc->compression = ctxt->input->buf->compressed;
    }

    /*
     * The Misc part of the Prolog
     */
    xmlParseMisc(ctxt);

    /*
     * Then possibly doc type declaration(s) and more Misc
     * (doctypedecl Misc*)?
     */
    GROW;
    if (CMP9(CUR_PTR, '<', '!', 'D', 'O', 'C', 'T', 'Y', 'P', 'E')) {

	ctxt->inSubset = 1;
	xmlParseDocTypeDecl(ctxt);
	if (RAW == '[') {
	    ctxt->instate = XML_PARSER_DTD;
	    xmlParseInternalSubset(ctxt);
	    if (ctxt->instate == XML_PARSER_EOF)
		return(-1);
	}

	/*
	 * Create and update the external subset.
	 */
	ctxt->inSubset = 2;
	if ((ctxt->sax != NULL) && (ctxt->sax->externalSubset != NULL) &&
	    (!ctxt->disableSAX))
	    ctxt->sax->externalSubset(ctxt->userData, ctxt->intSubName,
	                              ctxt->extSubSystem, ctxt->extSubURI);
	if (ctxt->instate == XML_PARSER_EOF)
	    return(-1);
	ctxt->inSubset = 0;

        xmlCleanSpecialAttr(ctxt);

	ctxt->instate = XML_PARSER_PROLOG;
	xmlParseMisc(ctxt);
    }

    /*
     * Time to start parsing the tree itself
     */
    GROW;
    if (RAW != '<') {
	xmlFatalErrMsg(ctxt, XML_ERR_DOCUMENT_EMPTY,
		       "Start tag expected, '<' not found\n");
    } else {
	ctxt->instate = XML_PARSER_CONTENT;
	xmlParseElement(ctxt);
	ctxt->instate = XML_PARSER_EPILOG;


	/*
	 * The Misc part at the end
	 */
	xmlParseMisc(ctxt);

	if (RAW != 0) {
	    xmlFatalErr(ctxt, XML_ERR_DOCUMENT_END, NULL);
	}
	ctxt->instate = XML_PARSER_EOF;
    }

    /*
     * SAX: end of the document processing.
     */
    if ((ctxt->sax) && (ctxt->sax->endDocument != NULL))
        ctxt->sax->endDocument(ctxt->userData);

    /*
     * Remove locally kept entity definitions if the tree was not built
     */
    if ((ctxt->myDoc != NULL) &&
	(xmlStrEqual(ctxt->myDoc->version, SAX_COMPAT_MODE))) {
	xmlFreeDoc(ctxt->myDoc);
	ctxt->myDoc = NULL;
    }

    if ((ctxt->wellFormed) && (ctxt->myDoc != NULL)) {
        ctxt->myDoc->properties |= XML_DOC_WELLFORMED;
	if (ctxt->valid)
	    ctxt->myDoc->properties |= XML_DOC_DTDVALID;
	if (ctxt->nsWellFormed)
	    ctxt->myDoc->properties |= XML_DOC_NSVALID;
	if (ctxt->options & XML_PARSE_OLD10)
	    ctxt->myDoc->properties |= XML_DOC_OLD10;
    }
    if (! ctxt->wellFormed) {
	ctxt->valid = 0;
	return(-1);
    }
    return(0);
}